

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::TraverseSchema::isIdentityConstraintName(TraverseSchema *this,XMLCh *name)

{
  bool bVar1;
  
  bVar1 = XMLString::equals(name,L"key");
  if (!bVar1) {
    bVar1 = XMLString::equals(name,(XMLCh *)SchemaSymbols::fgELT_KEYREF);
    if (!bVar1) {
      bVar1 = XMLString::equals(name,(XMLCh *)SchemaSymbols::fgELT_UNIQUE);
      return bVar1;
    }
  }
  return true;
}

Assistant:

bool TraverseSchema::isIdentityConstraintName(const XMLCh* const name) {

    return (XMLString::equals(name, SchemaSymbols::fgELT_KEY)
            || XMLString::equals(name, SchemaSymbols::fgELT_KEYREF)
            || XMLString::equals(name, SchemaSymbols::fgELT_UNIQUE));
}